

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.cpp
# Opt level: O3

utf8proc_ssize_t
duckdb::utf8proc_normalize_utf32
          (utf8proc_int32_t *buffer,utf8proc_ssize_t length,utf8proc_option_t options)

{
  uint uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  utf8proc_ssize_t uVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  undefined2 *puVar14;
  uint *puVar15;
  
  lVar13 = length;
  if ((options & (UTF8PROC_STRIPCC|UTF8PROC_NLF2LF)) != 0) {
    if (length < 1) {
      return 0;
    }
    lVar12 = 0;
    lVar13 = 0;
    do {
      iVar5 = buffer[lVar12];
      if (lVar12 < length + -1 && iVar5 == 0xd) {
        if (buffer[lVar12 + 1] == 10) {
          lVar12 = lVar12 + 1;
        }
LAB_018527cf:
        lVar10 = lVar13 + 1;
        if ((char)options < '\0') {
          if ((options >> 8 & 1) == 0) {
            buffer[lVar13] = 0x2028;
            lVar13 = lVar10;
          }
          else {
            buffer[lVar13] = 10;
            lVar13 = lVar10;
          }
        }
        else if ((options >> 8 & 1) == 0) {
          buffer[lVar13] = 0x20;
          lVar13 = lVar10;
        }
        else {
          buffer[lVar13] = 0x2029;
          lVar13 = lVar10;
        }
      }
      else {
        if ((((iVar5 == 10) || (iVar5 == 0xd)) || (iVar5 == 0x85)) ||
           (((options >> 9 & 1) != 0 && (iVar5 - 0xbU < 2)))) goto LAB_018527cf;
        if (((options >> 9 & 1) == 0) || (0x20 < iVar5 - 0x7fU && 0x1f < iVar5)) {
          buffer[lVar13] = iVar5;
LAB_01852840:
          lVar13 = lVar13 + 1;
        }
        else if (iVar5 == 9) {
          buffer[lVar13] = 0x20;
          goto LAB_01852840;
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < length);
  }
  if ((options & UTF8PROC_COMPOSE) == 0) {
    return lVar13;
  }
  uVar6 = 0;
  if (lVar13 < 1) {
    return 0;
  }
  uVar7 = 0xffff;
  puVar15 = (uint *)0x0;
  puVar14 = (undefined2 *)0x0;
  lVar12 = 0;
  do {
    uVar8 = buffer[lVar12];
    uVar2 = *(ushort *)
             (&DAT_01e81cf2 +
             (ulong)*(ushort *)
                     (&utf8proc_stage2table +
                     (ulong)((uVar8 & 0xff) + (uint)(ushort)(&utf8proc_stage1table)[(int)uVar8 >> 8]
                            ) * 2) * 0x18);
    if ((puVar15 == (uint *)0x0) || ((short)uVar2 <= (short)uVar7)) goto LAB_018529f3;
    uVar9 = *puVar15;
    if ((uVar8 - 0x1176 < 0xffffffeb) || (uVar9 - 0x1113 < 0xffffffed)) {
      uVar1 = uVar9 - 0xac00;
      if (((uVar1 < 0x2ba4) && (0xffffffe3 < uVar8 - 0x11c3)) &&
         (uVar11 = (uVar1 & 0xffff) >> 2,
         (short)uVar1 == (short)((short)(uVar11 / 7) * 0x1b + (short)(uVar11 / 7)))) {
        uVar8 = (uVar8 + uVar9) - 0x11a7;
        goto LAB_0185290c;
      }
      if (puVar14 == (undefined2 *)0x0) {
        puVar14 = &utf8proc_properties +
                  (ulong)*(ushort *)
                          (&utf8proc_stage2table +
                          (ulong)((uVar9 & 0xff) +
                                 (uint)(ushort)(&utf8proc_stage1table)[(int)uVar9 >> 8]) * 2) * 0xc;
      }
      uVar3 = puVar14[9];
      if (-1 < (short)uVar3) {
        uVar4 = *(ushort *)
                 (&DAT_01e81d02 +
                 (ulong)*(ushort *)
                         (&utf8proc_stage2table +
                         (ulong)((uVar8 & 0xff) +
                                (uint)(ushort)(&utf8proc_stage1table)[(int)uVar8 >> 8]) * 2) * 0x18)
        ;
        if (-2 < (short)uVar4) goto LAB_018529f3;
        uVar9 = uVar4 & 0x3fff;
        if ((uVar9 < *(ushort *)(utf8proc_combinations + (ulong)uVar3 * 2)) ||
           (*(ushort *)(utf8proc_combinations + (ulong)uVar3 * 2 + 2) < uVar9)) goto LAB_018529f3;
        lVar10 = ((ulong)(uVar9 + uVar3) + 2) -
                 (ulong)*(ushort *)(utf8proc_combinations + (ulong)uVar3 * 2);
        uVar9 = (uint)*(ushort *)(utf8proc_combinations + lVar10 * 2);
        if ((uVar4 >> 0xe & 1) != 0) {
          uVar9 = CONCAT22(*(ushort *)(utf8proc_combinations + lVar10 * 2),
                           *(undefined2 *)(utf8proc_combinations + (long)(int)lVar10 * 2 + 2));
        }
        if (((int)uVar9 < 1) ||
           (((options & UTF8PROC_STABLE) != 0 &&
            ((*(byte *)(&DAT_01e81d04 +
                       (ulong)*(ushort *)
                               (&utf8proc_stage2table +
                               (ulong)((uVar9 & 0xff) +
                                      (uint)(ushort)(&utf8proc_stage1table)[uVar9 >> 8]) * 2) * 6) &
             2) != 0)))) goto LAB_018529f3;
        *puVar15 = uVar9;
        goto LAB_0185290f;
      }
LAB_018529f3:
      buffer[uVar6] = uVar8;
      if ((short)uVar7 < (short)uVar2) {
        uVar7 = uVar2;
      }
      uVar7 = -(ushort)(uVar2 == 0) | uVar7;
      if (uVar2 == 0) {
        puVar15 = (uint *)(buffer + uVar6);
        puVar14 = (undefined2 *)0x0;
      }
      uVar6 = uVar6 + 1;
    }
    else {
      uVar8 = (uVar9 * 0x15 + uVar8) * 0x1c - 0x28469c;
LAB_0185290c:
      *puVar15 = uVar8;
LAB_0185290f:
      puVar14 = (undefined2 *)0x0;
    }
    lVar12 = lVar12 + 1;
    if (lVar13 == lVar12) {
      return uVar6;
    }
  } while( true );
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_normalize_utf32(utf8proc_int32_t *buffer, utf8proc_ssize_t length, utf8proc_option_t options) {
  /* UTF8PROC_NULLTERM option will be ignored, 'length' is never ignored */
  if (options & (UTF8PROC_NLF2LS | UTF8PROC_NLF2PS | UTF8PROC_STRIPCC)) {
    utf8proc_ssize_t rpos;
    utf8proc_ssize_t wpos = 0;
    utf8proc_int32_t uc;
    for (rpos = 0; rpos < length; rpos++) {
      uc = buffer[rpos];
      if (uc == 0x000D && rpos < length-1 && buffer[rpos+1] == 0x000A) rpos++;
      if (uc == 0x000A || uc == 0x000D || uc == 0x0085 ||
          ((options & UTF8PROC_STRIPCC) && (uc == 0x000B || uc == 0x000C))) {
        if (options & UTF8PROC_NLF2LS) {
          if (options & UTF8PROC_NLF2PS) {
            buffer[wpos++] = 0x000A;
          } else {
            buffer[wpos++] = 0x2028;
          }
        } else {
          if (options & UTF8PROC_NLF2PS) {
            buffer[wpos++] = 0x2029;
          } else {
            buffer[wpos++] = 0x0020;
          }
        }
          } else if ((options & UTF8PROC_STRIPCC) &&
              (uc < 0x0020 || (uc >= 0x007F && uc < 0x00A0))) {
            if (uc == 0x0009) buffer[wpos++] = 0x0020;
              } else {
                buffer[wpos++] = uc;
              }
    }
    length = wpos;
  }
  if (options & UTF8PROC_COMPOSE) {
    utf8proc_int32_t *starter = NULL;
    utf8proc_int32_t current_char;
    const utf8proc_property_t *starter_property = NULL, *current_property;
    utf8proc_propval_t max_combining_class = -1;
    utf8proc_ssize_t rpos;
    utf8proc_ssize_t wpos = 0;
    utf8proc_int32_t composition;
    for (rpos = 0; rpos < length; rpos++) {
      current_char = buffer[rpos];
      current_property = unsafe_get_property(current_char);
      if (starter && current_property->combining_class > max_combining_class) {
        /* combination perhaps possible */
        utf8proc_int32_t hangul_lindex;
        utf8proc_int32_t hangul_sindex;
        hangul_lindex = *starter - UTF8PROC_HANGUL_LBASE;
        if (hangul_lindex >= 0 && hangul_lindex < UTF8PROC_HANGUL_LCOUNT) {
          utf8proc_int32_t hangul_vindex;
          hangul_vindex = current_char - UTF8PROC_HANGUL_VBASE;
          if (hangul_vindex >= 0 && hangul_vindex < UTF8PROC_HANGUL_VCOUNT) {
            *starter = UTF8PROC_HANGUL_SBASE +
              (hangul_lindex * UTF8PROC_HANGUL_VCOUNT + hangul_vindex) *
              UTF8PROC_HANGUL_TCOUNT;
            starter_property = NULL;
            continue;
          }
        }
        hangul_sindex = *starter - UTF8PROC_HANGUL_SBASE;
        if (hangul_sindex >= 0 && hangul_sindex < UTF8PROC_HANGUL_SCOUNT &&
            (hangul_sindex % UTF8PROC_HANGUL_TCOUNT) == 0) {
          utf8proc_int32_t hangul_tindex;
          hangul_tindex = current_char - UTF8PROC_HANGUL_TBASE;
          if (hangul_tindex >= 0 && hangul_tindex < UTF8PROC_HANGUL_TCOUNT) {
            *starter += hangul_tindex;
            starter_property = NULL;
            continue;
          }
            }
        if (!starter_property) {
          starter_property = unsafe_get_property(*starter);
        }
        if (starter_property->comb_index < 0x8000 &&
            current_property->comb_index != UINT16_MAX &&
            current_property->comb_index >= 0x8000) {
          int sidx = starter_property->comb_index;
          int idx = current_property->comb_index & 0x3FFF;
          if (idx >= utf8proc_combinations[sidx] && idx <= utf8proc_combinations[sidx + 1] ) {
            idx += sidx + 2 - utf8proc_combinations[sidx];
            if (current_property->comb_index & 0x4000) {
              composition = (utf8proc_combinations[idx] << 16) | utf8proc_combinations[idx+1];
            } else
              composition = utf8proc_combinations[idx];

            if (composition > 0 && (!(options & UTF8PROC_STABLE) ||
                !(unsafe_get_property(composition)->comp_exclusion))) {
              *starter = composition;
              starter_property = NULL;
              continue;
                }
          }
            }
      }
      buffer[wpos] = current_char;
      if (current_property->combining_class) {
        if (current_property->combining_class > max_combining_class) {
          max_combining_class = current_property->combining_class;
        }
      } else {
        starter = buffer + wpos;
        starter_property = NULL;
        max_combining_class = -1;
      }
      wpos++;
    }
    length = wpos;
  }
  return length;
}